

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError * __thiscall
duckdb::CSVError::IncorrectColumnAmountError
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          idx_t actual_columns,LinesPerBoundary error_info,string *csv_row,idx_t row_byte_position,
          optional_idx byte_position,string *current_path)

{
  LinesPerBoundary error_info_p;
  LinesPerBoundary error_info_p_00;
  optional_idx current_path_00;
  ostream *poVar1;
  idx_t iVar2;
  string *csv_row_p;
  string *error_message_p;
  optional_idx local_3f0;
  optional_idx local_3e8;
  idx_t local_3e0;
  idx_t iStack_3d8;
  string local_3d0;
  idx_t local_3b0;
  idx_t iStack_3a8;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  ostringstream how_to_fix_it;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&how_to_fix_it);
  poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,"Possible fixes:");
  ::std::operator<<(poVar1,'\n');
  if ((this->full_error_message).field_2._M_local_buf[1] == '\x01') {
    poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,
                               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
                              );
    ::std::operator<<(poVar1,'\n');
  }
  if ((char)this[4].row_byte_position == '\0') {
    poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,
                               "* Enable null padding (null_padding=true) to replace missing values with NULL"
                              );
    ::std::operator<<(poVar1,'\n');
  }
  if (*(char *)((long)&this[1].error_message._M_dataplus._M_p + 1) == '\0') {
    poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,
                               "* Enable ignore errors (ignore_errors=true) to skip this row");
    ::std::operator<<(poVar1,'\n');
  }
  poVar1 = ::std::operator<<((ostream *)&error,"Expected Number of Columns: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = ::std::operator<<(poVar1," Found: ");
  ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  iVar2 = optional_idx::GetIndex((optional_idx *)&row_byte_position);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = optional_idx::GetIndex((optional_idx *)&row_byte_position);
    iVar2 = iVar2 - 1;
  }
  current_path_00.index = byte_position.index;
  if (options < *(CSVReaderOptions **)((long)&(this->full_error_message).field_2 + 8)) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::string((string *)&local_3a0,(string *)error_info.lines_in_batch);
    local_3e0 = actual_columns;
    iStack_3d8 = error_info.boundary_idx;
    optional_idx::optional_idx(&local_3f0,iVar2);
    ::std::__cxx11::stringbuf::str();
    error_message_p = &local_380;
    csv_row_p = &local_3a0;
    error_info_p.lines_in_batch = iStack_3d8;
    error_info_p.boundary_idx = local_3e0;
    CSVError(__return_storage_ptr__,error_message_p,TOO_FEW_COLUMNS,(idx_t)options,csv_row_p,
             error_info_p,(idx_t)csv_row,local_3f0,(CSVReaderOptions *)this,&local_3d0,
             (string *)current_path_00.index);
  }
  else {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::string((string *)&local_360,(string *)error_info.lines_in_batch);
    local_3b0 = actual_columns;
    iStack_3a8 = error_info.boundary_idx;
    optional_idx::optional_idx(&local_3e8,iVar2);
    ::std::__cxx11::stringbuf::str();
    error_message_p = &local_340;
    csv_row_p = &local_360;
    error_info_p_00.lines_in_batch = iStack_3a8;
    error_info_p_00.boundary_idx = local_3b0;
    CSVError(__return_storage_ptr__,error_message_p,TOO_MANY_COLUMNS,(idx_t)options,csv_row_p,
             error_info_p_00,(idx_t)csv_row,local_3e8,(CSVReaderOptions *)this,&local_3d0,
             (string *)current_path_00.index);
  }
  ::std::__cxx11::string::~string((string *)&local_3d0);
  ::std::__cxx11::string::~string((string *)csv_row_p);
  ::std::__cxx11::string::~string((string *)error_message_p);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&how_to_fix_it);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::IncorrectColumnAmountError(const CSVReaderOptions &options, idx_t actual_columns,
                                              LinesPerBoundary error_info, string &csv_row, idx_t row_byte_position,
                                              optional_idx byte_position, const string &current_path) {
	std::ostringstream error;
	// We don't have a fix for this
	std::ostringstream how_to_fix_it;
	how_to_fix_it << "Possible fixes:" << '\n';
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		how_to_fix_it << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not "
		                 "comply with the CSV standard."
		              << '\n';
	}
	if (!options.null_padding) {
		how_to_fix_it << "* Enable null padding (null_padding=true) to replace missing values with NULL" << '\n';
	}
	if (!options.ignore_errors.GetValue()) {
		how_to_fix_it << "* Enable ignore errors (ignore_errors=true) to skip this row" << '\n';
	}
	// How many columns were expected and how many were found
	error << "Expected Number of Columns: " << options.dialect_options.num_cols << " Found: " << actual_columns + 1;
	idx_t byte_pos = byte_position.GetIndex() == 0 ? 0 : byte_position.GetIndex() - 1;
	if (actual_columns >= options.dialect_options.num_cols) {
		return CSVError(error.str(), TOO_MANY_COLUMNS, actual_columns, csv_row, error_info, row_byte_position, byte_pos,
		                options, how_to_fix_it.str(), current_path);
	} else {
		return CSVError(error.str(), TOO_FEW_COLUMNS, actual_columns, csv_row, error_info, row_byte_position, byte_pos,
		                options, how_to_fix_it.str(), current_path);
	}
}